

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O0

void __thiscall MinVR::element::element(element *this,element *node)

{
  iterator iVar1;
  iterator iVar2;
  element *in_RSI;
  long in_RDI;
  string *the_value;
  element *peVar3;
  element *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  string local_30 [32];
  element *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>::list
            ((list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_> *)0x1356d9);
  std::_List_iterator<MinVR::attribute_*>::_List_iterator
            ((_List_iterator<MinVR::attribute_*> *)(in_RDI + 0x18));
  std::_List_iterator<MinVR::attribute_*>::_List_iterator
            ((_List_iterator<MinVR::attribute_*> *)(in_RDI + 0x20));
  the_value = (string *)(in_RDI + 0x28);
  std::__cxx11::list<MinVR::element_*,_std::allocator<MinVR::element_*>_>::list
            ((list<MinVR::element_*,_std::allocator<MinVR::element_*>_> *)0x135708);
  std::_List_iterator<MinVR::element_*>::_List_iterator
            ((_List_iterator<MinVR::element_*> *)(in_RDI + 0x40));
  std::_List_iterator<MinVR::element_*>::_List_iterator
            ((_List_iterator<MinVR::element_*> *)(in_RDI + 0x48));
  peVar3 = (element *)(in_RDI + 0x50);
  std::__cxx11::list<char_*,_std::allocator<char_*>_>::list
            ((list<char_*,_std::allocator<char_*>_> *)0x135737);
  std::_List_iterator<char_*>::_List_iterator((_List_iterator<char_*> *)(in_RDI + 0x68));
  std::_List_iterator<char_*>::_List_iterator((_List_iterator<char_*> *)(in_RDI + 0x70));
  *(undefined1 *)(in_RDI + 0x78) = 1;
  *(undefined1 *)(in_RDI + 0x79) = 0;
  *(undefined1 *)(in_RDI + 0x7a) = 0;
  *(undefined8 *)(in_RDI + 0x80) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x88));
  *(undefined8 *)(in_RDI + 0xa8) = 0;
  if (local_10 != (element *)0x0) {
    get_value_abi_cxx11_(in_stack_ffffffffffffff48);
    set_value(peVar3,the_value);
    std::__cxx11::string::~string(local_30);
    peVar3 = (element *)get_name(local_10);
    set_name(peVar3,in_stack_ffffffffffffff50);
    get_attribute_list_abi_cxx11_(in_stack_ffffffffffffff48);
    std::__cxx11::list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>::operator=
              ((list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_> *)the_value,
               &peVar3->m_attribute_list);
    std::__cxx11::list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>::~list
              ((list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_> *)0x13582e);
    get_element_list_abi_cxx11_(in_stack_ffffffffffffff48);
    std::__cxx11::list<MinVR::element_*,_std::allocator<MinVR::element_*>_>::operator=
              ((list<MinVR::element_*,_std::allocator<MinVR::element_*>_> *)the_value,
               (list<MinVR::element_*,_std::allocator<MinVR::element_*>_> *)peVar3);
    std::__cxx11::list<MinVR::element_*,_std::allocator<MinVR::element_*>_>::~list
              ((list<MinVR::element_*,_std::allocator<MinVR::element_*>_> *)0x13585f);
  }
  iVar1 = std::__cxx11::list<MinVR::element_*,_std::allocator<MinVR::element_*>_>::begin
                    ((list<MinVR::element_*,_std::allocator<MinVR::element_*>_> *)
                     in_stack_ffffffffffffff48);
  *(_List_node_base **)(in_RDI + 0x40) = iVar1._M_node;
  iVar2 = std::__cxx11::list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>::begin
                    (&in_stack_ffffffffffffff48->m_attribute_list);
  *(_List_node_base **)(in_RDI + 0x20) = iVar2._M_node;
  return;
}

Assistant:

element::element(element* node) : is_empty_attribute_list(true),
                               //value_is_allocated(false),
                               name_is_allocated(false),
                               is_comment(false),
                               m_name(NULL),
                               //m_value(NULL),
                               m_parent(NULL)
{
    if(node != NULL)
    {
        set_value(node->get_value());
        set_name(node->get_name());
        m_attribute_list = node->get_attribute_list();
        m_element_list = node->get_element_list();
    }
    m_element_iterator = m_element_list.begin();
    m_attribute_iterator = m_attribute_list.begin();
}